

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sspm.cpp
# Opt level: O2

void __thiscall pg::SSPMSolver::stream_tmp(SSPMSolver *this,ostream *out,int h)

{
  uint uVar1;
  ostream *this_00;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  int d;
  int iVar9;
  
  if (*this->tmp_d == -1) {
    pcVar5 = " \x1b[1;33mTop\x1b[m";
  }
  else {
    std::operator<<(out," { ");
    lVar7 = 0;
    uVar1 = ~(h >> 0x1f) & h;
    for (uVar2 = 0; uVar2 != uVar1; uVar2 = uVar2 + 1) {
      if (uVar2 != 0) {
        std::operator<<(out,",");
      }
      iVar9 = 0;
      for (lVar7 = (long)(int)lVar7; (lVar7 < this->l && (this->tmp_d[lVar7] == uVar2));
          lVar7 = lVar7 + 1) {
        std::ostream::_M_insert<bool>(SUB81(out,0));
        iVar9 = iVar9 + -1;
      }
      if (iVar9 == 0) {
        std::operator<<(out,anon_var_dwarf_200a4b);
      }
    }
    std::operator<<(out," }");
    std::operator<<(out," {");
    uVar8 = 0;
    for (uVar2 = 0; uVar2 != uVar1; uVar2 = uVar2 + 1) {
      uVar3 = 0;
      uVar4 = this->l - (int)uVar8;
      for (uVar8 = (ulong)(int)uVar8; (long)uVar8 < (long)this->l; uVar8 = uVar8 + 1) {
        if (this->tmp_d[uVar8] != uVar2) {
          uVar3 = uVar3 | ~(-1 << (uVar4 & 0x1f));
          break;
        }
        uVar6 = 1 << (uVar4 & 0x1f);
        if (((this->tmp_b)._bits[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) == 0) {
          uVar6 = 0;
        }
        uVar4 = uVar4 - 1;
        uVar3 = uVar3 | uVar6;
      }
      this_00 = std::operator<<((this->super_Solver).logger," ");
      std::ostream::operator<<(this_00,uVar3);
    }
    pcVar5 = " }";
  }
  std::operator<<(out,pcVar5);
  return;
}

Assistant:

void
SSPMSolver::stream_tmp(std::ostream &out, int h)
{
    if (tmp_d[0] == -1) {
        out << " \033[1;33mTop\033[m";
    } else {
        out << " { ";
        int j=0;
        for (int i=0; i<h; i++) {
            if (i>0) out << ",";
            int c=0;
            while (j<l and tmp_d[j] == i) {
                c++;
                out << tmp_b[j];
                j++;
            }
            if (c == 0) out << "ε";
        }
        out << " }";

        out << " {";

        // compute value
        int i=0;
        for (int d=0; d<h; d++) {
            int val = 0;

            for (; i<l; i++) {
                if (tmp_d[i] != d) {
                    // e found
                    val |= ((1 << (l-i)) - 1);
                    break;
                }

                if (tmp_b[i]) val |= (1 << (l-i));
            }

            logger << " " << val;
        }

        out << " }";
    }
}